

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

tuple<char_*const_*,_bool> __thiscall
pstore::command_line::details::parse_option_arguments<char*const*,std::ostream>
          (details *this,char **first_arg,char **last_arg,string *program_name,
          basic_ostream<char,_std::char_traits<char>_> *errs)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  option **ppoVar4;
  string *psVar5;
  ostream *poVar6;
  czstring pcVar7;
  _Head_base<0UL,_char_*const_*,_false> extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *errs_00;
  basic_ostream<char,_std::char_traits<char>_> *in_R9;
  tuple<char_*const_*,_bool> tVar8;
  maybe<pstore::command_line::option_*,_void> local_1d8;
  string local_1c8 [32];
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> local_1a8;
  maybe<pstore::command_line::option_*,_void> local_190;
  maybe<pstore::command_line::option_*,_void> local_180;
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> local_170;
  maybe<pstore::command_line::option_*,_void> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [16];
  string local_138 [32];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_118;
  int local_cc;
  maybe<pstore::command_line::option_*,_void> local_c8;
  maybe<pstore::command_line::option_*,_void> local_b8 [2];
  allocator local_91;
  undefined1 local_90 [8];
  string arg_name;
  sticky_bool<false> local_69;
  undefined1 local_68 [7];
  sticky_bool<false> ok;
  maybe<pstore::command_line::option_*,_void> handler;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> value
  ;
  basic_ostream<char,_std::char_traits<char>_> *errs_local;
  string *program_name_local;
  char **last_arg_local;
  char **first_arg_local;
  
  errs_00 = errs;
  last_arg_local = first_arg;
  first_arg_local = (char **)this;
  nothing<std::__cxx11::string>();
  nothing<pstore::command_line::option*>();
  sticky_bool<false>::sticky_bool(&local_69,true);
  for (; last_arg_local != last_arg; last_arg_local = last_arg_local + 1) {
    pcVar1 = *last_arg_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_90,pcVar1,&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    maybe<pstore::command_line::option_*,_void>::maybe
              (local_b8,(maybe<pstore::command_line::option_*,_void> *)local_68);
    bVar2 = handler_takes_argument(local_b8);
    maybe<pstore::command_line::option_*,_void>::~maybe(local_b8);
    if (bVar2) {
      maybe<pstore::command_line::option_*,_void>::maybe
                (&local_c8,(maybe<pstore::command_line::option_*,_void> *)local_68);
      bVar2 = handler_set_value(&local_c8,(string *)local_90);
      sticky_bool<false>::operator=(&local_69,bVar2);
      maybe<pstore::command_line::option_*,_void>::~maybe(&local_c8);
      maybe<pstore::command_line::option_*,_void>::reset
                ((maybe<pstore::command_line::option_*,_void> *)local_68);
      local_cc = 4;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"--");
      if (bVar2) {
        last_arg_local = last_arg_local + 1;
        local_cc = 2;
      }
      else {
        bVar2 = argument_is_positional((string *)local_90);
        if (bVar2) {
          local_cc = 2;
        }
        else {
          bVar2 = starts_with((string *)local_90,"--");
          if (bVar2) {
            std::__cxx11::string::string(local_138,(string *)local_90);
            get_option_and_value(&local_118,(string *)local_138);
            std::tie<std::__cxx11::string,pstore::maybe<std::__cxx11::string,void>>
                      (local_148,
                       (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)local_90);
            std::tuple<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&>::operator=
                      ((tuple<std::__cxx11::string&,pstore::maybe<std::__cxx11::string,void>&> *)
                       local_148,&local_118);
            std::
            tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
            ::~tuple(&local_118);
            std::__cxx11::string::~string(local_138);
            find_handler(&local_158,(string *)local_90);
            maybe<pstore::command_line::option_*,_void>::operator=
                      ((maybe<pstore::command_line::option_*,_void> *)local_68,&local_158);
            maybe<pstore::command_line::option_*,_void>::~maybe(&local_158);
            bVar2 = maybe::operator_cast_to_bool((maybe *)local_68);
            if (bVar2) {
              ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                                  ((maybe<pstore::command_line::option_*,_void> *)local_68);
              uVar3 = (*(*ppoVar4)->_vptr_option[9])();
              if ((uVar3 & 1) == 0) {
                maybe<pstore::command_line::option_*,_void>::maybe
                          (&local_180,(maybe<pstore::command_line::option_*,_void> *)local_68);
                errs_00 = errs;
                record_value_if_available<std::ostream>
                          (&local_170,(details *)&local_180,
                           (maybe<pstore::command_line::option_*,_void> *)&handler.storage_.__align,
                           (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                            *)program_name,(string *)errs,in_R9);
                std::
                tie<pstore::maybe<pstore::command_line::option*,void>,pstore::command_line::details::sticky_bool<false>>
                          (&local_190,(sticky_bool<false> *)local_68);
                std::
                tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                ::operator=((tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                             *)&local_190,&local_170);
                std::tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool>::~tuple
                          (&local_170);
                maybe<pstore::command_line::option_*,_void>::~maybe(&local_180);
                goto LAB_0010b2a6;
              }
            }
            report_unknown_option<std::ostream>
                      (program_name,(string *)local_90,
                       (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)&handler.storage_.__align,errs);
            sticky_bool<false>::operator=(&local_69,false);
            local_cc = 4;
          }
          else {
            std::__cxx11::string::string(local_1c8,(string *)local_90);
            process_single_dash<std::ostream>
                      (&local_1a8,(details *)local_1c8,program_name,(string *)errs,errs_00);
            std::
            tie<pstore::maybe<pstore::command_line::option*,void>,pstore::command_line::details::sticky_bool<false>>
                      (&local_1d8,(sticky_bool<false> *)local_68);
            std::
            tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
            ::operator=((tuple<pstore::maybe<pstore::command_line::option*,void>&,pstore::command_line::details::sticky_bool<false>&>
                         *)&local_1d8,&local_1a8);
            std::tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool>::~tuple
                      (&local_1a8);
            std::__cxx11::string::~string(local_1c8);
LAB_0010b2a6:
            local_cc = 0;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_90);
    if ((local_cc != 0) && (local_cc == 2)) break;
  }
  bVar2 = maybe::operator_cast_to_bool((maybe *)local_68);
  if (bVar2) {
    ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                        ((maybe<pstore::command_line::option_*,_void> *)local_68);
    uVar3 = (*(*ppoVar4)->_vptr_option[0xe])();
    if ((uVar3 & 1) != 0) {
      psVar5 = stream_trait<char>::out_string(program_name);
      poVar6 = std::operator<<(errs,(string *)psVar5);
      pcVar7 = stream_trait<char>::out_text(": Argument \'");
      poVar6 = std::operator<<(poVar6,pcVar7);
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                          ((maybe<pstore::command_line::option_*,_void> *)local_68);
      psVar5 = option::name_abi_cxx11_(*ppoVar4);
      psVar5 = stream_trait<char>::out_string(psVar5);
      poVar6 = std::operator<<(poVar6,(string *)psVar5);
      pcVar7 = stream_trait<char>::out_text("\' requires a value\n");
      std::operator<<(poVar6,pcVar7);
      sticky_bool<false>::operator=(&local_69,false);
    }
  }
  sticky_bool::operator_cast_to_bool((sticky_bool *)&local_69);
  std::make_tuple<char*const*&,bool>((char ***)this,(bool *)&last_arg_local);
  local_cc = 1;
  maybe<pstore::command_line::option_*,_void>::~maybe
            ((maybe<pstore::command_line::option_*,_void> *)local_68);
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  ~maybe((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)&handler.storage_.__align);
  tVar8.super__Tuple_impl<0UL,_char_*const_*,_bool>.super__Head_base<0UL,_char_*const_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_char_*const_*,_bool>._0_8_ = this;
  return (tuple<char_*const_*,_bool>)tVar8.super__Tuple_impl<0UL,_char_*const_*,_bool>;
}

Assistant:

std::tuple<InputIterator, bool>
            parse_option_arguments (InputIterator first_arg, InputIterator last_arg,
                                    std::string const & program_name, ErrorStream & errs) {
                using str = stream_trait<typename ErrorStream::char_type>;
                auto value = nothing<std::string> ();
                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};

                for (; first_arg != last_arg; ++first_arg) {
                    std::string arg_name = *first_arg;
                    // Is this the argument for the preceeding switch?
                    if (handler_takes_argument (handler)) {
                        ok = handler_set_value (handler, arg_name);
                        handler.reset ();
                        continue;
                    }

                    // A double-dash argument on its own indicates that the following are
                    // positional arguments.
                    if (arg_name == "--") {
                        ++first_arg; // swallow this argument.
                        break;
                    }
                    // If this argument has no leading dash, this and the following are
                    // positional arguments.
                    if (argument_is_positional (arg_name)) {
                        break;
                    }

                    if (starts_with (arg_name, "--")) {
                        std::tie (arg_name, value) = get_option_and_value (arg_name);

                        handler = find_handler (arg_name);
                        if (!handler || (*handler)->is_positional ()) {
                            report_unknown_option (program_name, arg_name, value, errs);
                            ok = false;
                            continue;
                        }

                        std::tie (handler, ok) =
                            record_value_if_available (handler, value, program_name, errs);
                    } else {
                        std::tie (handler, ok) = process_single_dash (arg_name, program_name, errs);
                    }
                }

                if (handler && (*handler)->takes_argument ()) {
                    errs << str::out_string (program_name) << str::out_text (": Argument '")
                         << str::out_string ((*handler)->name ())
                         << str::out_text ("' requires a value\n");
                    ok = false;
                }
                return std::make_tuple (first_arg, static_cast<bool> (ok));
            }